

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qp2passes.hpp
# Opt level: O3

QP2PassNodeResult __thiscall mp::QP2PassVisitor::Visit(QP2PassVisitor *this,Expr e,double f)

{
  longdouble lVar1;
  int iVar2;
  
  if ((f == 0.0) && (!NAN(f))) {
    return 0;
  }
  lVar1 = this->factor_;
  this->factor_ = lVar1 * (longdouble)f;
  iVar2 = BasicExprVisitor<mp::QP2PassVisitor,_int,_mp::internal::ExprTypes>::Visit
                    ((BasicExprVisitor<mp::QP2PassVisitor,_int,_mp::internal::ExprTypes> *)this,e);
  this->factor_ = lVar1;
  return iVar2;
}

Assistant:

QP2PassNodeResult QP2PassVisitor::Visit(Expr e, double f) {
  if (f) {
    auto f_save = factor_;
    factor_ *= f;
    auto result = Visit(e);
    factor_ = f_save;
    return result;
  }
  return 0;
}